

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ProcessReturningSubqueries(ExprList *pEList,Table *pTab)

{
  long lVar1;
  ExprList *in_RDI;
  long in_FS_OFFSET;
  Walker w;
  Walker *in_stack_ffffffffffffffc8;
  short local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&stack0xffffffffffffffc8,0xaa,0x30);
  memset(&stack0xffffffffffffffc8,0,0x30);
  sqlite3WalkExprList(in_stack_ffffffffffffffc8,in_RDI);
  if (local_14 != 0) {
    sqlite3WalkExprList(in_stack_ffffffffffffffc8,in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3ProcessReturningSubqueries(
  ExprList *pEList,
  Table *pTab
){
  Walker w;
  memset(&w, 0, sizeof(w));
  w.xExprCallback = sqlite3ExprWalkNoop;
  w.xSelectCallback = sqlite3ReturningSubqueryCorrelated;
  w.u.pTab = pTab;
  sqlite3WalkExprList(&w, pEList);
  if( w.eCode ){
    w.xExprCallback = sqlite3ReturningSubqueryVarSelect;
    w.xSelectCallback = sqlite3SelectWalkNoop;
    sqlite3WalkExprList(&w, pEList);
  }
}